

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::HdlcSimulationDataGenerator(HdlcSimulationDataGenerator *this)

{
  HdlcSimulationDataGenerator *this_local;
  
  this->mSettings = (HdlcAnalyzerSettings *)0x0;
  this->mSimulationSampleRateHz = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mAbortFramesIndexes);
  this->mFrameNumber = 0;
  this->mAbortByte = 0;
  this->mWrongFramesSeparation = 0;
  this->mControlValue = '\0';
  this->mAddresByteValue = '\0';
  this->mInformationByteValue = '\0';
  SimulationChannelDescriptor::SimulationChannelDescriptor(&this->mHdlcSimulationData);
  this->mSamplesInHalfPeriod = 0;
  this->mSamplesInAFlag = 0;
  this->mFrameTypes[0] = HDLC_I_FRAME;
  this->mFrameTypes[1] = HDLC_S_FRAME;
  this->mFrameTypes[2] = HDLC_U_FRAME;
  return;
}

Assistant:

HdlcSimulationDataGenerator::HdlcSimulationDataGenerator()
    : mSettings( 0 ),
      mSimulationSampleRateHz( 0 ),
      mFrameNumber( 0 ),
      mAbortByte( 0 ),
      mWrongFramesSeparation( 0 ),
      mControlValue( 0 ),
      mAddresByteValue( 0 ),
      mInformationByteValue( 0 ),
      mSamplesInHalfPeriod( 0 ),
      mSamplesInAFlag( 0 )

{
    mFrameTypes[ 0 ] = HDLC_I_FRAME;
    mFrameTypes[ 1 ] = HDLC_S_FRAME;
    mFrameTypes[ 2 ] = HDLC_U_FRAME;
}